

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O2

void __thiscall GenCADFile::fill_signals_cache(GenCADFile *this)

{
  int iVar1;
  int iVar2;
  GenCADFile *pGVar3;
  mpc_ast_t *parent;
  char *pcVar4;
  mapped_type *pmVar5;
  GenCADFile *this_00;
  char *node_pin_name;
  char *node_comp_name;
  ComponentPin key;
  char *local_90;
  char *local_88;
  GenCADFile *local_80;
  map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_78 = &this->m_signals_cache;
  iVar1 = 0;
  local_80 = this;
  while( true ) {
    pGVar3 = local_80;
    iVar1 = mpc_ast_get_index_lb(local_80->signals_ast,"signal|>",iVar1);
    if (iVar1 < 0) break;
    pGVar3 = (GenCADFile *)mpc_ast_get_child_lb(pGVar3->signals_ast,"signal|>",iVar1);
    iVar2 = 0;
    while( true ) {
      iVar2 = mpc_ast_get_index_lb((mpc_ast_t *)pGVar3,"node|>",iVar2);
      if (iVar2 < 0) break;
      this_00 = pGVar3;
      parent = mpc_ast_get_child_lb((mpc_ast_t *)pGVar3,"node|>",iVar2);
      local_88 = get_nonquoted_or_quoted_string_child(this_00,parent,"component_name");
      local_90 = get_nonquoted_or_quoted_string_child(this_00,parent,"pin_name");
      pcVar4 = get_stringtoend_child(this_00,(mpc_ast_t *)pGVar3,"sig_name_to_end");
      if (((pcVar4 != (char *)0x0) && (local_88 != (char *)0x0)) && (local_90 != (char *)0x0)) {
        std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
        _Tuple_impl<char*&,char*&,void>
                  ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_70,&local_88
                   ,&local_90);
        pmVar5 = std::
                 map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_78,(key_type *)&local_70);
        std::__cxx11::string::assign((char *)pmVar5);
        std::
        _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Tuple_impl(&local_70);
      }
      iVar2 = iVar2 + 1;
    }
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

void GenCADFile::fill_signals_cache() {
	for (int i = 0;;) {
		i = mpc_ast_get_index_lb(signals_ast, "signal|>", i);
		if (i < 0) break;
		mpc_ast_t *signal_ast = mpc_ast_get_child_lb(signals_ast, "signal|>", i);
		for (int j = 0;;) {
			j = mpc_ast_get_index_lb(signal_ast, "node|>", j);
			if (j < 0) break;
			mpc_ast_t *node_ast           = mpc_ast_get_child_lb(signal_ast, "node|>", j);
			char *node_comp_name = get_nonquoted_or_quoted_string_child(node_ast, "component_name");
			char *node_pin_name = get_nonquoted_or_quoted_string_child(node_ast, "pin_name");
			char *signal_name = get_stringtoend_child(signal_ast, "sig_name_to_end");
			if (node_comp_name && node_pin_name && signal_name) {
				ComponentPin key{node_comp_name, node_pin_name};
				m_signals_cache[key] = signal_name;
			}
			j++;
		}
		i++;
	}
}